

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_setfenv(lua_State *L,int idx)

{
  int iVar1;
  GCObject *pGVar2;
  TValue *pTVar3;
  int iVar4;
  
  pTVar3 = index2adr(L,idx);
  iVar1 = pTVar3->tt;
  if (iVar1 == 8) {
    pGVar2 = (pTVar3->value).gc;
    (pGVar2->th).l_gt.value = L->top[-1].value;
    (pGVar2->th).l_gt.tt = 5;
  }
  else {
    if ((iVar1 != 7) && (iVar4 = 0, iVar1 != 6)) goto LAB_00105416;
    (((pTVar3->value).gc)->h).array = (TValue *)L->top[-1].value;
  }
  pGVar2 = L->top[-1].value.gc;
  iVar4 = 1;
  if ((((pGVar2->gch).marked & 3) != 0) && (((((pTVar3->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierf(L,(pTVar3->value).gc,pGVar2);
  }
LAB_00105416:
  L->top = L->top + -1;
  return iVar4;
}

Assistant:

LUA_API int lua_setfenv (lua_State *L, int idx) {
  StkId o;
  int res = 1;
  lua_lock(L);
  api_checknelems(L, 1);
  o = index2adr(L, idx);
  api_checkvalidindex(L, o);
  api_check(L, ttistable(L->top - 1));
  switch (ttype(o)) {
    case LUA_TFUNCTION:
      clvalue(o)->c.env = hvalue(L->top - 1);
      break;
    case LUA_TUSERDATA:
      uvalue(o)->env = hvalue(L->top - 1);
      break;
    case LUA_TTHREAD:
      sethvalue(L, gt(thvalue(o)), hvalue(L->top - 1));
      break;
    default:
      res = 0;
      break;
  }
  if (res) luaC_objbarrier(L, gcvalue(o), hvalue(L->top - 1));
  L->top--;
  lua_unlock(L);
  return res;
}